

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O3

int archive_write_mtree_header(archive_write *a,archive_entry *entry)

{
  char cVar1;
  size_t sVar2;
  unsigned_long uVar3;
  time_t tVar4;
  dev_t dVar5;
  archive_string *as;
  mode_t mVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int64_t iVar10;
  archive_entry *entry_00;
  time_t t;
  mtree_entry_conflict *pmVar11;
  char *pcVar12;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar13;
  char *extraout_RDX_02;
  char *fn;
  char *extraout_RDX_03;
  char *pcVar14;
  char *pcVar15;
  dir_info *rbt;
  mtree_entry_conflict *me;
  ulong uVar16;
  undefined8 *puVar17;
  mtree_entry_conflict *pmVar18;
  char name [256];
  mtree_entry_conflict *local_170;
  archive_string local_168;
  undefined8 *local_150;
  archive_string *local_148;
  mtree_entry_conflict *local_140;
  char local_138 [264];
  
  puVar17 = (undefined8 *)a->format_data;
  if (*(int *)(puVar17 + 0xe) != 0) {
    *(undefined4 *)(puVar17 + 0xe) = 0;
    archive_strcat((archive_string *)(puVar17 + 0xb),"#mtree\n");
    if ((*(uint *)(puVar17 + 0x1e) & 0x380238) == 0) {
      *(undefined4 *)((long)puVar17 + 0xfc) = 0;
    }
  }
  iVar10 = archive_entry_size(entry);
  puVar17[0xf] = iVar10;
  if ((*(int *)((long)puVar17 + 0xf4) != 0) &&
     (mVar6 = archive_entry_filetype(entry), mVar6 != 0x4000)) {
    return 0;
  }
  iVar7 = mtree_entry_new(a,entry,&local_170);
  me = local_170;
  if (iVar7 < -0x14) {
    return iVar7;
  }
  pcVar12 = (char *)a->format_data;
  sVar2 = (local_170->parentdir).length;
  if (sVar2 == 0) {
    if (((local_170->basename).length != 1) || (*(local_170->basename).s != '.')) {
      pcVar12 = (local_170->pathname).s;
      pcVar14 = "Internal programing error in generating canonical name for %s";
      goto LAB_0015117f;
    }
    local_170->parent = local_170;
    pmVar11 = *(mtree_entry_conflict **)(pcVar12 + 8);
    if (pmVar11 == (mtree_entry_conflict *)0x0) {
      *(mtree_entry_conflict **)(pcVar12 + 8) = local_170;
LAB_00151049:
      me->next = (mtree_entry_conflict *)0x0;
      **(undefined8 **)(pcVar12 + 0x38) = me;
      *(mtree_entry_conflict ***)(pcVar12 + 0x38) = &me->next;
      goto LAB_001512c1;
    }
  }
  else {
    pcVar14 = (local_170->parentdir).s;
    local_148 = (archive_string *)(pcVar12 + 0x18);
    pcVar15 = extraout_RDX;
    if ((*(size_t *)(pcVar12 + 0x20) == sVar2) &&
       (iVar8 = strcmp(local_148->s,pcVar14), pcVar15 = extraout_RDX_00, iVar8 == 0)) {
      iVar8 = __archive_rb_tree_insert_node
                        (*(archive_rb_tree **)(*(long *)(pcVar12 + 0x10) + 0x28),&me->rbnode);
      if (iVar8 != 0) {
        me->parent = *(mtree_entry_conflict **)(pcVar12 + 0x10);
        goto LAB_00151049;
      }
      rbt = (*(mtree_entry_conflict **)(pcVar12 + 0x10))->dir_info;
    }
    else {
      pmVar18 = *(mtree_entry_conflict **)(pcVar12 + 8);
      uVar9 = get_path_component(local_138,(size_t)pcVar14,pcVar15);
      pcVar15 = pcVar14;
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        pcVar13 = extraout_RDX_01;
        do {
          while( true ) {
            if ((int)uVar9 < 0) goto LAB_0015112f;
            if (((uVar9 == 1) && (local_138[0] == '.')) && (pmVar18 != (mtree_entry_conflict *)0x0))
            break;
            if (pmVar18 == (mtree_entry_conflict *)0x0) {
              pmVar18 = (mtree_entry_conflict *)0x0;
              goto LAB_00150e5b;
            }
LAB_00150daf:
            pmVar11 = (mtree_entry_conflict *)
                      __archive_rb_tree_find_node(&pmVar18->dir_info->rbtree,local_138);
            if (pmVar11 == (mtree_entry_conflict *)0x0) goto LAB_00150e5b;
            if (*pcVar15 == '\0') goto LAB_0015115d;
            if (pmVar11->dir_info == (dir_info *)0x0) {
              archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",
                                (pmVar11->pathname).s,(me->pathname).s);
              goto LAB_0015118e;
            }
            pcVar15 = pcVar15 + (ulong)(pcVar15[uVar9] == '/') + (ulong)uVar9;
            uVar9 = get_path_component(local_138,(size_t)pcVar15,fn);
            pcVar13 = extraout_RDX_03;
            pmVar18 = pmVar11;
            if (uVar9 == 0) {
              uVar9 = 0;
              goto LAB_00150e5b;
            }
          }
          if (pmVar18 != *(mtree_entry_conflict **)(pcVar12 + 8)) goto LAB_00150daf;
          if (pcVar15[1] == '/') {
            pcVar15 = pcVar15 + 2;
          }
          else {
            pcVar15 = pcVar15 + 1;
          }
          uVar9 = get_path_component(local_138,(size_t)pcVar15,pcVar13);
          pcVar13 = extraout_RDX_02;
        } while (uVar9 != 0);
        uVar9 = 0;
      }
LAB_00150e5b:
      cVar1 = *pcVar15;
      local_150 = puVar17;
      as = local_148;
      while (local_148 = as, cVar1 != '\0') {
        uVar16 = (ulong)uVar9;
        local_168.s = (char *)0x0;
        local_168.length = 0;
        local_168.buffer_length = 0;
        archive_strncat(&local_168,pcVar14,(size_t)(pcVar15 + (uVar16 - (long)pcVar14)));
        pcVar13 = local_168.s;
        if (local_168.s[local_168.length - 1] == '/') {
          local_168.s[local_168.length - 1] = '\0';
          local_168.length = local_168.length - 1;
        }
        entry_00 = archive_entry_new();
        if (entry_00 == (archive_entry *)0x0) {
LAB_00151068:
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
          archive_string_free(&local_168);
          goto LAB_00151146;
        }
        archive_entry_copy_pathname(entry_00,pcVar13);
        archive_entry_set_mode(entry_00,0x41ed);
        t = time((time_t *)0x0);
        archive_entry_set_mtime(entry_00,t,0);
        iVar8 = mtree_entry_new(a,entry_00,&local_140);
        archive_entry_free(entry_00);
        pmVar11 = local_140;
        if (iVar8 < -0x14) goto LAB_00151068;
        local_140->dir_info->virtual = 1;
        archive_string_free(&local_168);
        pcVar13 = (pmVar11->pathname).s;
        if ((*pcVar13 == '.') && (pcVar13[1] == '\0')) {
          *(mtree_entry_conflict **)(pcVar12 + 8) = pmVar11;
          pmVar18 = pmVar11;
        }
        else {
          __archive_rb_tree_insert_node(&pmVar18->dir_info->rbtree,&pmVar11->rbnode);
        }
        pmVar11->parent = pmVar18;
        pmVar11->next = (mtree_entry_conflict *)0x0;
        **(undefined8 **)(pcVar12 + 0x38) = pmVar11;
        *(mtree_entry_conflict ***)(pcVar12 + 0x38) = &pmVar11->next;
        pcVar15 = pcVar15 + (pcVar15[uVar16] == '/') + uVar16;
        uVar9 = get_path_component(local_138,(size_t)pcVar15,pcVar12);
        if ((int)uVar9 < 0) {
          archive_string_free(&local_168);
LAB_0015112f:
          archive_set_error(&a->archive,-1,"A name buffer is too small");
LAB_00151146:
          iVar7 = -0x1e;
          goto LAB_00151193;
        }
        pmVar18 = pmVar11;
        as = local_148;
        cVar1 = *pcVar15;
      }
      *(mtree_entry_conflict **)(pcVar12 + 0x10) = pmVar18;
      pcVar12[0x20] = '\0';
      pcVar12[0x21] = '\0';
      pcVar12[0x22] = '\0';
      pcVar12[0x23] = '\0';
      pcVar12[0x24] = '\0';
      pcVar12[0x25] = '\0';
      pcVar12[0x26] = '\0';
      pcVar12[0x27] = '\0';
      archive_string_ensure(as,(pmVar18->parentdir).length + (pmVar18->basename).length + 2);
      puVar17 = local_150;
      sVar2 = (pmVar18->parentdir).length;
      if ((pmVar18->basename).length + sVar2 == 0) {
        *as->s = '\0';
      }
      else {
        if (sVar2 != 0) {
          pcVar12[0x20] = '\0';
          pcVar12[0x21] = '\0';
          pcVar12[0x22] = '\0';
          pcVar12[0x23] = '\0';
          pcVar12[0x24] = '\0';
          pcVar12[0x25] = '\0';
          pcVar12[0x26] = '\0';
          pcVar12[0x27] = '\0';
          archive_string_concat(as,&pmVar18->parentdir);
          archive_strappend_char(as,'/');
        }
        archive_string_concat(as,&pmVar18->basename);
      }
      iVar8 = __archive_rb_tree_insert_node(&pmVar18->dir_info->rbtree,&me->rbnode);
      if (iVar8 != 0) {
        me->parent = pmVar18;
        me->next = (mtree_entry_conflict *)0x0;
        **(undefined8 **)(pcVar12 + 0x38) = me;
        *(mtree_entry_conflict ***)(pcVar12 + 0x38) = &me->next;
        me = local_170;
        goto LAB_001512c1;
      }
      rbt = pmVar18->dir_info;
    }
    pmVar11 = (mtree_entry_conflict *)__archive_rb_tree_find_node(&rbt->rbtree,(me->basename).s);
  }
LAB_0015115d:
  if (((me->mode ^ pmVar11->mode) & 0xf000) != 0) {
    pcVar12 = (pmVar11->pathname).s;
    pcVar14 = "Found duplicate entries `%s\' and its file type is different";
LAB_0015117f:
    archive_set_error(&a->archive,-1,pcVar14,pcVar12);
LAB_0015118e:
    iVar7 = -0x19;
LAB_00151193:
    mtree_entry_free(local_170);
    return iVar7;
  }
  (pmVar11->symlink).length = 0;
  archive_string_concat(&pmVar11->symlink,&me->symlink);
  (pmVar11->uname).length = 0;
  archive_string_concat(&pmVar11->uname,&me->uname);
  (pmVar11->gname).length = 0;
  archive_string_concat(&pmVar11->gname,&me->gname);
  (pmVar11->fflags_text).length = 0;
  archive_string_concat(&pmVar11->fflags_text,&me->fflags_text);
  mVar6 = me->filetype;
  pmVar11->nlink = me->nlink;
  pmVar11->filetype = mVar6;
  pmVar11->mode = me->mode;
  iVar10 = me->uid;
  pmVar11->size = me->size;
  pmVar11->uid = iVar10;
  uVar3 = me->fflags_clear;
  pmVar11->fflags_set = me->fflags_set;
  pmVar11->fflags_clear = uVar3;
  tVar4 = me->mtime;
  pmVar11->gid = me->gid;
  pmVar11->mtime = tVar4;
  pmVar11->mtime_nsec = me->mtime_nsec;
  dVar5 = me->rdevminor;
  pmVar11->rdevmajor = me->rdevmajor;
  pmVar11->rdevminor = dVar5;
  dVar5 = me->devminor;
  pmVar11->devmajor = me->devmajor;
  pmVar11->devminor = dVar5;
  pmVar11->ino = me->ino;
  if (pmVar11->dir_info != (dir_info *)0x0) {
    pmVar11->dir_info->virtual = 0;
  }
  mtree_entry_free(me);
  me = pmVar11;
LAB_001512c1:
  *puVar17 = me;
  if (me->reg_info == (reg_info *)0x0) {
    return iVar7;
  }
  *(undefined4 *)(puVar17 + 0x1c) = 0;
  if ((*(byte *)(puVar17 + 0x1e) & 1) != 0) {
    puVar17[0x1c] = 1;
    puVar17[0x1d] = 0;
    return iVar7;
  }
  return iVar7;
}

Assistant:

static int
archive_write_mtree_header(struct archive_write *a,
    struct archive_entry *entry)
{
	struct mtree_writer *mtree= a->format_data;
	struct mtree_entry *mtree_entry;
	int r, r2;

	if (mtree->first) {
		mtree->first = 0;
		archive_strcat(&mtree->buf, "#mtree\n");
		if ((mtree->keys & SET_KEYS) == 0)
			mtree->output_global_set = 0;/* Disabled. */
	}

	mtree->entry_bytes_remaining = archive_entry_size(entry);

	/* While directory only mode, we do not handle non directory files. */
	if (mtree->dironly && archive_entry_filetype(entry) != AE_IFDIR)
		return (ARCHIVE_OK);

	r2 = mtree_entry_new(a, entry, &mtree_entry);
	if (r2 < ARCHIVE_WARN)
		return (r2);
	r = mtree_entry_tree_add(a, &mtree_entry);
	if (r < ARCHIVE_WARN) {
		mtree_entry_free(mtree_entry);
		return (r);
	}
	mtree->mtree_entry = mtree_entry;

	/* If the current file is a regular file, we have to
	 * compute the sum of its content.
	 * Initialize a bunch of sum check context. */
	if (mtree_entry->reg_info)
		sum_init(mtree);

	return (r2);
}